

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equal.c
# Opt level: O1

size_t Qiniu_Eq_Fwrite(void *buf,size_t unused,size_t n,Qiniu_Eq *self)

{
  void *pvVar1;
  Qiniu_FnRead p_Var2;
  int iVar3;
  void *__s2;
  size_t sVar4;
  uint uVar5;
  
  if (self->result != 0) {
    pvVar1 = (self->v).self;
    p_Var2 = (self->v).Read;
    __s2 = malloc(n);
    sVar4 = (*p_Var2)(__s2,1,n,pvVar1);
    uVar5 = 0;
    if (sVar4 == n) {
      iVar3 = bcmp(buf,__s2,n);
      uVar5 = (uint)(iVar3 == 0);
    }
    free(__s2);
    self->result = uVar5;
  }
  return n;
}

Assistant:

size_t Qiniu_Eq_Fwrite(const void *buf, size_t unused, size_t n, Qiniu_Eq *self)
{
	if (self->result)
	{
		self->result = Qiniu_StartWith(self->v, buf, n);
	}
	return n;
}